

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_dynamic_precision<int>
          (specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,int arg_id)

{
  int iVar1;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  
  get_arg(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
  error_handler((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
                 *)in_RDI[2]);
  iVar1 = get_dynamic_spec<fmt::v6::internal::precision_checker,fmt::v6::basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>,fmt::v6::internal::error_handler>
                    ();
  *(int *)(*in_RDI + 4) = iVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void on_dynamic_precision(Id arg_id) {
    this->specs_.precision = get_dynamic_spec<precision_checker>(
        get_arg(arg_id), context_.error_handler());
  }